

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3StreamReader.cpp
# Opt level: O1

int __thiscall
AC3StreamReader::getTSDescriptor
          (AC3StreamReader *this,uint8_t *dstBuff,bool blurayMode,bool hdmvDescriptors)

{
  uint8_t uVar1;
  uint8_t *end;
  int iVar2;
  uint8_t *buf;
  long lVar3;
  uint64_t uVar4;
  uint uVar5;
  int i;
  int iVar6;
  BitStreamWriter bitWriter;
  BitStreamWriter local_58;
  uint8_t *local_38;
  
  (this->super_AC3Codec).m_testMode = true;
  buf = AC3Codec::findFrame((this->super_SimplePacketizerReader).super_AbstractStreamReader.m_buffer
                            ,(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                             m_bufEnd);
  if (buf == (uint8_t *)0x0) {
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    local_38 = dstBuff;
    for (; (iVar6 < 2 &&
           (end = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd,
           buf < end)); buf = buf + iVar2 + lVar3) {
      local_58.super_BitStream.m_totalBits = 0;
      iVar2 = AC3Codec::decodeFrame(&this->super_AC3Codec,buf,end,(int *)&local_58);
      if (iVar2 < 1) break;
      lVar3 = (long)(int)local_58.super_BitStream.m_totalBits;
      uVar4 = AC3Codec::getFrameDuration(&this->super_AC3Codec);
      iVar6 = (iVar6 + 1) - (uint)(uVar4 == 0);
    }
    uVar5 = 0;
    (this->super_AC3Codec).m_state = stateDecodeAC3;
    (this->super_AC3Codec).m_testMode = false;
    local_58.super_BitStream.m_buffer = (uint *)(local_38 + 8);
    uVar1 = (this->super_AC3Codec).m_bsidBase;
    local_38[0] = '\x05';
    local_38[1] = '\x04';
    local_58.super_BitStream.m_initBuffer = local_58.super_BitStream.m_buffer;
    if (uVar1 == '\0') {
      local_38[2] = 'E';
      local_38[3] = 'A';
      local_38[4] = 'C';
      local_38[5] = '3';
      local_38[6] = 0xcc;
      local_38[7] = '\x04';
      local_58.super_BitStream.m_totalBits = 0x20;
      local_58.m_curVal = 0;
      local_58.m_bitWrited = 0;
      BitStreamWriter::putBits(&local_58,4,0xc);
      uVar5 = 1;
      BitStreamWriter::putBits(&local_58,1,(uint)(this->super_AC3Codec).m_mixinfoexists);
      BitStreamWriter::putBits(&local_58,3,0);
      BitStreamWriter::putBits(&local_58,5,0x18);
      uVar1 = (this->super_AC3Codec).m_acmod;
      if (uVar1 != '\0') {
        if (uVar1 == '\x01') {
          uVar5 = 0;
        }
        else if (uVar1 == '\x02') {
          uVar5 = 3 - ((this->super_AC3Codec).m_dsurmod == '\0');
        }
        else {
          uVar5 = 4;
        }
      }
      if ((this->super_AC3Codec).m_extChannelsExists != false) {
        uVar5 = 5;
      }
      BitStreamWriter::putBits(&local_58,3,uVar5);
      BitStreamWriter::putBits(&local_58,3,1);
      BitStreamWriter::putBits(&local_58,5,(uint)(this->super_AC3Codec).m_bsid);
      uVar5 = 0x80;
    }
    else {
      local_38[2] = 'A';
      local_38[3] = 'C';
      local_38[4] = '-';
      local_38[5] = '3';
      local_38[6] = 0x81;
      local_38[7] = '\x04';
      local_58.super_BitStream.m_totalBits = 0x20;
      local_58.m_curVal = 0;
      local_58.m_bitWrited = 0;
      BitStreamWriter::putBits(&local_58,3,(uint)(this->super_AC3Codec).m_fscod);
      BitStreamWriter::putBits(&local_58,5,(uint)(this->super_AC3Codec).m_bsidBase);
      BitStreamWriter::putBits(&local_58,6,(this->super_AC3Codec).m_frmsizecod >> 1);
      BitStreamWriter::putBits(&local_58,2,(uint)(this->super_AC3Codec).m_dsurmod);
      BitStreamWriter::putBits(&local_58,3,(uint)(this->super_AC3Codec).m_bsmod);
      BitStreamWriter::putBits(&local_58,4,(uint)(this->super_AC3Codec).m_acmod);
      BitStreamWriter::putBits(&local_58,1,0);
    }
    BitStreamWriter::putBits(&local_58,8,uVar5);
    BitStreamWriter::flushBits(&local_58);
    iVar6 = 0xc;
  }
  return iVar6;
}

Assistant:

int AC3StreamReader::getTSDescriptor(uint8_t* dstBuff, bool blurayMode, bool hdmvDescriptors)
{
    AC3Codec::setTestMode(true);
    uint8_t* frame = findFrame(m_buffer, m_bufEnd);
    if (frame == nullptr)
        return 0;
    for (int i = 0; i < 2 && frame < m_bufEnd;)
    {
        int skipBytes = 0;
        int skipBeforeBytes = 0;
        const int len = decodeFrame(frame, m_bufEnd, skipBytes, skipBeforeBytes);
        if (len < 1)
        {
            // m_state = stateDecodeAC3;
            // AC3Codec::setTestMode(false);
            // return 0;
            break;
        }
        frame += len + skipBytes;
        if (getFrameDuration() > 0)
            i++;
    }
    m_state = AC3State::stateDecodeAC3;
    AC3Codec::setTestMode(false);
    BitStreamWriter bitWriter{};

    if (isAC3())
    {
        // ATSC A/52 Annex A Table A3.1 AC-3 Registration Descriptor
        *dstBuff++ = static_cast<uint8_t>(TSDescriptorTag::REGISTRATION);  // descriptor tag
        *dstBuff++ = 4;                                                    // decriptor length
        *dstBuff++ = 'A';
        *dstBuff++ = 'C';
        *dstBuff++ = '-';
        *dstBuff++ = '3';

        // ATSC A/52 Annex A Table A4.1 AC-3 Audio Descriptor Syntax
        *dstBuff++ = static_cast<uint8_t>(TSDescriptorTag::AC3);  // AC-3_audio_stream_descriptor
        *dstBuff++ = 4;                                           // descriptor len

        bitWriter.setBuffer(dstBuff, dstBuff + 4);

        bitWriter.putBits(3, m_fscod);     // bitrate code
        bitWriter.putBits(5, m_bsidBase);  // 6 = AC3

        bitWriter.putBits(6, m_frmsizecod >> 1);  // MSB == 0. bit rate is exact
        bitWriter.putBits(2, m_dsurmod);

        bitWriter.putBits(3, m_bsmod);
        bitWriter.putBits(4, m_acmod);  // when MSB == 0 then high (4-th) bit always 0
        bitWriter.putBit(0);            // full_svc

        bitWriter.putBits(8, 0);  // langcod
        bitWriter.flushBits();

        return 12;
    }

    // Not AC3 => EAC3
    // ATSC A/52 Annex G 2.EAC3 Registration Descriptor
    *dstBuff++ = static_cast<int>(TSDescriptorTag::REGISTRATION);  // descriptor tag
    *dstBuff++ = 4;                                                // descriptor length
    *dstBuff++ = 'E';
    *dstBuff++ = 'A';
    *dstBuff++ = 'C';
    *dstBuff++ = '3';

    // ATSC A/52 Annex G Table G.1
    *dstBuff++ = static_cast<int>(TSDescriptorTag::EAC3);  // EAC3_audio_stream_descriptor
    *dstBuff++ = 4;                                        // descriptor len

    bitWriter.setBuffer(dstBuff, dstBuff + 4);

    bitWriter.putBits(4, 12);  // reserved = 1, bsid_flag = 1, mainid_flag = 0, asvc_flag = 0
    bitWriter.putBits(1, m_mixinfoexists);
    bitWriter.putBits(3, 0);  // independant substreams not supported

    bitWriter.putBits(5, 24);  // reserved = 1, full_service_flag = 1, audio_service_type = 0 (Complete Main)
    int number_of_channels = (m_acmod == 0 ? 1 : (m_acmod == 1 ? 0 : (m_acmod == 2 ? (m_dsurmod ? 3 : 2) : 4)));
    if (m_extChannelsExists)
        number_of_channels = 5;
    bitWriter.putBits(3, number_of_channels);

    bitWriter.putBits(3, 1);  // language_flag = 0, language_flag2 = 0, reserved = 1
    bitWriter.putBits(5, m_bsid);

    bitWriter.putBits(8, 0x80);  // additional_info_byte
    bitWriter.flushBits();

    return 12;
}